

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O2

void __thiscall
Diligent::RefCountersImpl::Attach<Diligent::SerializationDeviceImpl,Diligent::IMemoryAllocator>
          (RefCountersImpl *this,SerializationDeviceImpl *pObject,IMemoryAllocator *pAllocator)

{
  string msg;
  
  if ((this->m_ObjectState)._M_i != NotInitialized) {
    FormatString<char[33]>(&msg,(char (*) [33])"Object has already been attached");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Attach",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
               ,0x10d);
    std::__cxx11::string::~string((string *)&msg);
  }
  this->m_ObjectWrapperBuffer[0] = (size_t)&PTR_DestroyObject_00a4d9c0;
  this->m_ObjectWrapperBuffer[1] = (size_t)pObject;
  this->m_ObjectWrapperBuffer[2] = (size_t)pAllocator;
  LOCK();
  (this->m_ObjectState)._M_i = Alive;
  UNLOCK();
  return;
}

Assistant:

void Attach(ObjectType* pObject, AllocatorType* pAllocator)
    {
        VERIFY(m_ObjectState.load() == ObjectState::NotInitialized, "Object has already been attached");
        static_assert(sizeof(ObjectWrapper<ObjectType, AllocatorType>) == sizeof(m_ObjectWrapperBuffer), "Unexpected object wrapper size");
        new (m_ObjectWrapperBuffer) ObjectWrapper<ObjectType, AllocatorType>{pObject, pAllocator};
        m_ObjectState.store(ObjectState::Alive);
    }